

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConnectorFederateManager.cpp
# Opt level: O2

void __thiscall helics::ConnectorFederateManager::closeAllConnectors(ConnectorFederateManager *this)

{
  long *plVar1;
  Interface *this_00;
  Translator **ppTVar2;
  int iVar3;
  handle trans;
  handle filts;
  BlockIterator<helics::Translator,_32,_helics::Translator_**> local_a8;
  iterator local_88;
  iterator local_70;
  handle local_58;
  handle local_40;
  
  if (this->coreObject != (Core *)0x0) {
    gmlc::libguarded::
    shared_guarded_opt<gmlc::containers::StringMappedVector<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>,_(reference_stability)0,_5>,_std::shared_mutex>
    ::lock(&local_40,&this->filters);
    gmlc::containers::
    StableBlockVector<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>,_5U,_std::allocator<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>_>_>
    ::begin((iterator *)&local_70,&(local_40.data)->dataStorage);
    gmlc::containers::
    StableBlockVector<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>,_5U,_std::allocator<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>_>_>
    ::end((iterator *)&local_88,&(local_40.data)->dataStorage);
    iVar3 = local_88.offset;
    ppTVar2 = local_88.vec;
    local_a8.vec._0_4_ = local_70.vec._0_4_;
    local_a8.vec._4_4_ = local_70.vec._4_4_;
    local_a8.ptr._0_4_ = local_70.ptr._0_4_;
    local_a8.ptr._4_4_ = local_70.ptr._4_4_;
    local_a8.offset = local_70.offset;
    local_a8._20_4_ = local_70._20_4_;
    while ((local_a8.offset != iVar3 ||
           ((Translator **)CONCAT44(local_a8.vec._4_4_,local_a8.vec._0_4_) != ppTVar2))) {
      plVar1 = (long *)CONCAT44(local_a8.ptr._4_4_,local_a8.ptr._0_4_);
      (*this->coreObject->_vptr_Core[0x30])(this->coreObject,(ulong)*(uint *)(*plVar1 + 0x10));
      Interface::disconnectFromCore((Interface *)*plVar1);
      gmlc::containers::
      BlockIterator<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>,_32,_std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>_**>
      ::operator++((BlockIterator<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>,_32,_std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>_**>
                    *)&local_a8);
    }
    gmlc::libguarded::
    shared_guarded_opt<gmlc::containers::StringMappedVector<helics::Translator,_(reference_stability)0,_5>,_std::shared_mutex>
    ::lock(&local_58,&this->translators);
    gmlc::containers::StableBlockVector<helics::Translator,_5U,_std::allocator<helics::Translator>_>
    ::begin(&local_70,&(local_58.data)->dataStorage);
    gmlc::containers::StableBlockVector<helics::Translator,_5U,_std::allocator<helics::Translator>_>
    ::end(&local_88,&(local_58.data)->dataStorage);
    local_a8.vec._0_4_ = local_70.vec._0_4_;
    local_a8.vec._4_4_ = local_70.vec._4_4_;
    local_a8.ptr._0_4_ = local_70.ptr._0_4_;
    local_a8.ptr._4_4_ = local_70.ptr._4_4_;
    local_a8.offset = local_70.offset;
    local_a8._20_4_ = local_70._20_4_;
    while ((local_a8.offset != local_88.offset ||
           ((Translator **)CONCAT44(local_a8.vec._4_4_,local_a8.vec._0_4_) != local_88.vec))) {
      this_00 = (Interface *)CONCAT44(local_a8.ptr._4_4_,local_a8.ptr._0_4_);
      (*this->coreObject->_vptr_Core[0x30])(this->coreObject,(ulong)(uint)(this_00->handle).hid);
      Interface::disconnectFromCore(this_00);
      gmlc::containers::BlockIterator<helics::Translator,_32,_helics::Translator_**>::operator++
                (&local_a8);
    }
    std::unique_lock<std::shared_mutex>::~unique_lock(&local_58.m_handle_lock);
    std::unique_lock<std::shared_mutex>::~unique_lock(&local_40.m_handle_lock);
  }
  return;
}

Assistant:

void ConnectorFederateManager::closeAllConnectors()
{
    if (coreObject != nullptr) {
        auto filts = filters.lock();
        filts->modify([this](auto& filt) {
            coreObject->closeHandle(filt->getHandle());
            filt->disconnectFromCore();
        });

        auto trans = translators.lock();
        trans->modify([this](auto& tran) {
            coreObject->closeHandle(tran.getHandle());
            tran.disconnectFromCore();
        });
    }
}